

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

char * read_string(Lexer *lexer,CharBuff *buff)

{
  bool bVar1;
  char cVar2;
  uint uVar3;
  char *pcVar4;
  bool bVar5;
  
  bVar5 = true;
LAB_00102598:
  do {
    uVar3 = read_chr(lexer);
    if (uVar3 != 0x22) {
      if (uVar3 == 0xc9) {
        pcVar4 = to_string(buff);
        lexer_error("String is not closed normally",pcVar4,lexer->row_pos,lexer->col_pos);
        goto LAB_0010260f;
      }
      if (uVar3 != 0x27) {
        append_chr(buff,(char)uVar3);
        goto LAB_00102598;
      }
    }
    append_chr(buff,(char)uVar3);
    bVar1 = !bVar5;
    bVar5 = false;
    if (bVar1) {
      bVar5 = false;
      cVar2 = buff_get(buff,0);
      if (uVar3 == (int)cVar2) {
LAB_0010260f:
        pcVar4 = to_string(buff);
        return pcVar4;
      }
    }
  } while( true );
}

Assistant:

char *read_string(Lexer *lexer, CharBuff* buff) {
    int chr;
    int flag = 0;
    while ((chr = read_chr(lexer)) != END) {
        if (chr == '\'' || chr == '"') {
            append_chr(buff, (char) chr);
            if (flag && chr == buff_get(buff, 0)) {
                break;
            }
            flag = 1;
        } else {
            append_chr(buff, (char) chr);
        }
    }
    if (chr == END) {
        lexer_error("String is not closed normally",
                    to_string(buff),
                    lexer->row_pos,
                    lexer->col_pos);
    }
    return to_string(buff);;
}